

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

void * CVodeCreate(int lmm,SUNContext sunctx)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  int line;
  char *msgfmt;
  
  if (lmm - 3U < 0xfffffffe) {
    msgfmt = "Illegal value for lmm. The legal values are CV_ADAMS and CV_BDF.";
    line = 0x1dd;
  }
  else if (sunctx == (SUNContext)0x0) {
    msgfmt = "sunctx = NULL illegal.";
    line = 0x1e3;
  }
  else {
    puVar2 = (undefined8 *)calloc(1,0xa80);
    if (puVar2 != (undefined8 *)0x0) {
      uVar1 = 5;
      if (lmm == 1) {
        uVar1 = 0xc;
      }
      *puVar2 = sunctx;
      *(int *)(puVar2 + 4) = lmm;
      puVar2[1] = 0x3cb0000000000000;
      *(undefined4 *)(puVar2 + 8) = 1;
      *(undefined4 *)(puVar2 + 0xb3) = uVar1;
      puVar2[0xb4] = 500;
      *(undefined4 *)(puVar2 + 0xb5) = 10;
      puVar2[0xbb] = 0x3ff8000000000000;
      puVar2[0xbc] = 0x40c3880000000000;
      puVar2[0xbd] = 0x4024000000000000;
      puVar2[0xbe] = 0x4024000000000000;
      puVar2[0xbf] = 0x3fb999999999999a;
      puVar2[0xc0] = 0x3fb999999999999a;
      puVar2[0xc1] = 0x3fc999999999999a;
      puVar2[0xc2] = 0x3fd0000000000000;
      puVar2[0xc3] = 10;
      *(undefined4 *)(puVar2 + 0xc4) = 2;
      *(undefined8 *)((long)puVar2 + 0x5ac) = 0xa00000007;
      puVar2[0xb1] = 0x3fb999999999999a;
      puVar2[0xfd] = 0x14;
      puVar2[0xfe] = 0x3fd3333333333333;
      *(undefined4 *)(puVar2 + 0x13a) = 1;
      *(undefined4 *)(puVar2 + 0x11) = 1;
      puVar2[0x13] = cvSensRhsInternalDQ;
      puVar2[0x14] = cvSensRhs1InternalDQ;
      puVar2[0x16] = 0x100000001;
      *(undefined4 *)(puVar2 + 0x1a) = 1;
      *(undefined4 *)(puVar2 + 0x24) = 1;
      *(undefined4 *)(puVar2 + 0x106) = uVar1;
      *(undefined4 *)((long)puVar2 + 0x834) = uVar1;
      *(undefined4 *)(puVar2 + 0x107) = uVar1;
      puVar2[0xe3] = 0x60;
      puVar2[0xe4] = 0x34;
      *(undefined4 *)((long)puVar2 + 0x764) = 0xffffffff;
      return puVar2;
    }
    msgfmt = "Allocation of cvode_mem failed.";
    line = 0x1eb;
  }
  cvProcessError((CVodeMem)0x0,0,line,"CVodeCreate",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return (void *)0x0;
}

Assistant:

void* CVodeCreate(int lmm, SUNContext sunctx)
{
  int maxord;
  CVodeMem cv_mem;

  /* Test inputs */

  if ((lmm != CV_ADAMS) && (lmm != CV_BDF))
  {
    cvProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSGCV_BAD_LMM);
    return (NULL);
  }

  if (sunctx == NULL)
  {
    cvProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSGCV_NULL_SUNCTX);
    return (NULL);
  }

  cv_mem = NULL;
  cv_mem = (CVodeMem)malloc(sizeof(struct CVodeMemRec));
  if (cv_mem == NULL)
  {
    cvProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSGCV_CVMEM_FAIL);
    return (NULL);
  }

  /* Zero out cv_mem */
  memset(cv_mem, 0, sizeof(struct CVodeMemRec));

  maxord = (lmm == CV_ADAMS) ? ADAMS_Q_MAX : BDF_Q_MAX;

  /* Copy input parameters into cv_mem */
  cv_mem->cv_sunctx = sunctx;
  cv_mem->cv_lmm    = lmm;

  /* Set uround */
  cv_mem->cv_uround = SUN_UNIT_ROUNDOFF;

  /* Set default values for integrator optional inputs */
  cv_mem->cv_f                = NULL;
  cv_mem->cv_user_data        = NULL;
  cv_mem->cv_itol             = CV_NN;
  cv_mem->cv_atolmin0         = SUNTRUE;
  cv_mem->cv_user_efun        = SUNFALSE;
  cv_mem->cv_efun             = NULL;
  cv_mem->cv_e_data           = NULL;
  cv_mem->cv_monitorfun       = NULL;
  cv_mem->cv_monitor_interval = 0;
  cv_mem->cv_qmax             = maxord;
  cv_mem->cv_mxstep           = MXSTEP_DEFAULT;
  cv_mem->cv_mxhnil           = MXHNIL_DEFAULT;
  cv_mem->cv_sldeton          = SUNFALSE;
  cv_mem->cv_hin              = ZERO;
  cv_mem->cv_hmin             = HMIN_DEFAULT;
  cv_mem->cv_hmax_inv         = HMAX_INV_DEFAULT;
  cv_mem->cv_eta_min_fx       = ETA_MIN_FX_DEFAULT;
  cv_mem->cv_eta_max_fx       = ETA_MAX_FX_DEFAULT;
  cv_mem->cv_eta_max_fs       = ETA_MAX_FS_DEFAULT;
  cv_mem->cv_eta_max_es       = ETA_MAX_ES_DEFAULT;
  cv_mem->cv_eta_max_gs       = ETA_MAX_GS_DEFAULT;
  cv_mem->cv_eta_min          = ETA_MIN_DEFAULT;
  cv_mem->cv_eta_min_ef       = ETA_MIN_EF_DEFAULT;
  cv_mem->cv_eta_max_ef       = ETA_MAX_EF_DEFAULT;
  cv_mem->cv_eta_cf           = ETA_CF_DEFAULT;
  cv_mem->cv_small_nst        = SMALL_NST_DEFAULT;
  cv_mem->cv_small_nef        = SMALL_NEF_DEFAULT;
  cv_mem->cv_tstopset         = SUNFALSE;
  cv_mem->cv_tstopinterp      = SUNFALSE;
  cv_mem->cv_maxnef           = MXNEF;
  cv_mem->cv_maxncf           = MXNCF;
  cv_mem->cv_nlscoef          = CORTES;
  cv_mem->cv_msbp             = MSBP_DEFAULT;
  cv_mem->cv_dgmax_lsetup     = DGMAX_LSETUP_DEFAULT;
  cv_mem->convfail            = CV_NO_FAILURES;
  cv_mem->cv_constraints      = NULL;
  cv_mem->cv_constraintsSet   = SUNFALSE;

  /* Initialize root finding variables */

  cv_mem->cv_glo     = NULL;
  cv_mem->cv_ghi     = NULL;
  cv_mem->cv_grout   = NULL;
  cv_mem->cv_iroots  = NULL;
  cv_mem->cv_rootdir = NULL;
  cv_mem->cv_gfun    = NULL;
  cv_mem->cv_nrtfn   = 0;
  cv_mem->cv_gactive = NULL;
  cv_mem->cv_mxgnull = 1;

  /* Initialize projection variables */
  cv_mem->proj_mem     = NULL;
  cv_mem->proj_enabled = SUNFALSE;
  cv_mem->proj_applied = SUNFALSE;

  /* Set default values for quad. optional inputs */

  cv_mem->cv_quadr     = SUNFALSE;
  cv_mem->cv_fQ        = NULL;
  cv_mem->cv_errconQ   = SUNFALSE;
  cv_mem->cv_itolQ     = CV_NN;
  cv_mem->cv_atolQmin0 = SUNTRUE;

  /* Set default values for sensi. optional inputs */

  cv_mem->cv_sensi     = SUNFALSE;
  cv_mem->cv_fS_data   = NULL;
  cv_mem->cv_fS        = cvSensRhsInternalDQ;
  cv_mem->cv_fS1       = cvSensRhs1InternalDQ;
  cv_mem->cv_fSDQ      = SUNTRUE;
  cv_mem->cv_ifS       = CV_ONESENS;
  cv_mem->cv_DQtype    = CV_CENTERED;
  cv_mem->cv_DQrhomax  = ZERO;
  cv_mem->cv_p         = NULL;
  cv_mem->cv_pbar      = NULL;
  cv_mem->cv_plist     = NULL;
  cv_mem->cv_errconS   = SUNFALSE;
  cv_mem->cv_ncfS1     = NULL;
  cv_mem->cv_ncfnS1    = NULL;
  cv_mem->cv_nniS1     = NULL;
  cv_mem->cv_nnfS1     = NULL;
  cv_mem->cv_itolS     = CV_NN;
  cv_mem->cv_atolSmin0 = NULL;

  /* Set default values for quad. sensi. optional inputs */

  cv_mem->cv_quadr_sensi = SUNFALSE;
  cv_mem->cv_fQS         = NULL;
  cv_mem->cv_fQS_data    = NULL;
  cv_mem->cv_fQSDQ       = SUNTRUE;
  cv_mem->cv_errconQS    = SUNFALSE;
  cv_mem->cv_itolQS      = CV_NN;
  cv_mem->cv_atolQSmin0  = NULL;

  /* Set default for ASA */

  cv_mem->cv_adj     = SUNFALSE;
  cv_mem->cv_adj_mem = NULL;

  /* Set the saved value for qmax_alloc */

  cv_mem->cv_qmax_alloc  = maxord;
  cv_mem->cv_qmax_allocQ = maxord;
  cv_mem->cv_qmax_allocS = maxord;

  /* Initialize lrw and liw */

  cv_mem->cv_lrw = 65 + 2 * L_MAX + NUM_TESTS;
  cv_mem->cv_liw = 52;

  /* No mallocs have been done yet */

  cv_mem->cv_VabstolMallocDone     = SUNFALSE;
  cv_mem->cv_MallocDone            = SUNFALSE;
  cv_mem->cv_constraintsMallocDone = SUNFALSE;

  cv_mem->cv_VabstolQMallocDone = SUNFALSE;
  cv_mem->cv_QuadMallocDone     = SUNFALSE;

  cv_mem->cv_VabstolSMallocDone = SUNFALSE;
  cv_mem->cv_SabstolSMallocDone = SUNFALSE;
  cv_mem->cv_SensMallocDone     = SUNFALSE;

  cv_mem->cv_VabstolQSMallocDone = SUNFALSE;
  cv_mem->cv_SabstolQSMallocDone = SUNFALSE;
  cv_mem->cv_QuadSensMallocDone  = SUNFALSE;

  cv_mem->cv_adjMallocDone = SUNFALSE;

  /* Initialize nonlinear solver variables */
  cv_mem->NLS    = NULL;
  cv_mem->ownNLS = SUNFALSE;

  cv_mem->NLSsim        = NULL;
  cv_mem->ownNLSsim     = SUNFALSE;
  cv_mem->zn0Sim        = NULL;
  cv_mem->ycorSim       = NULL;
  cv_mem->ewtSim        = NULL;
  cv_mem->simMallocDone = SUNFALSE;

  cv_mem->NLSstg        = NULL;
  cv_mem->ownNLSstg     = SUNFALSE;
  cv_mem->zn0Stg        = NULL;
  cv_mem->ycorStg       = NULL;
  cv_mem->ewtStg        = NULL;
  cv_mem->stgMallocDone = SUNFALSE;

  cv_mem->NLSstg1    = NULL;
  cv_mem->ownNLSstg1 = SUNFALSE;

  cv_mem->sens_solve     = SUNFALSE;
  cv_mem->sens_solve_idx = -1;

  /* Return pointer to CVODES memory block */

  return ((void*)cv_mem);
}